

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strispassword_s.c
# Opt level: O1

_Bool strispassword_s(char *dest,rsize_t dmax)

{
  long lVar1;
  uint uVar2;
  rsize_t rVar3;
  errno_t error;
  uint uVar4;
  uint uVar5;
  char *msg;
  int iVar6;
  char cVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strispassword_s: dest is null";
    error = 400;
  }
  else if (dmax < 6) {
    msg = "strispassword_s: dest is too short";
    error = 0x192;
  }
  else {
    if (dmax < 0x21) {
      if (*dest == '\0') {
LAB_00105ab4:
        uVar5 = 0;
      }
      else {
        cVar7 = *dest;
        uVar5 = 0;
        if (cVar7 != '\0') {
          rVar3 = 0;
          iVar6 = 0;
          uVar2 = 0;
          uVar4 = 0;
          do {
            if (dmax == rVar3) {
              msg = "strispassword_s: dest is unterminated";
              error = 0x197;
              goto LAB_001059d4;
            }
            if ((byte)(cVar7 - 0x30U) < 10) {
              iVar6 = iVar6 + 1;
            }
            else if ((byte)(cVar7 + 0x9fU) < 0x1a) {
              uVar4 = uVar4 + 1;
            }
            else if ((byte)(cVar7 + 0xbfU) < 0x1a) {
              uVar2 = uVar2 + 1;
            }
            else {
              if ((((0xe < (byte)(cVar7 - 0x21U)) && (6 < (byte)(cVar7 - 0x3aU))) &&
                  (3 < (byte)(cVar7 + 0xa5U))) &&
                 ((1 < (byte)(cVar7 + 0xa1U) && ((byte)(cVar7 + 0x81U) < 0xfc)))) goto LAB_00105ab4;
              uVar5 = uVar5 + 1;
            }
            cVar7 = dest[rVar3 + 1];
            rVar3 = rVar3 + 1;
          } while (cVar7 != '\0');
          uVar5 = (uint)((uVar5 != 0 && 1 < uVar2) &&
                        ((1 < uVar4 && iVar6 != 0) && (int)rVar3 - 1U < 0x1f));
        }
      }
      goto LAB_001059d9;
    }
    msg = "strispassword_s: dest exceeds max";
    error = 0x193;
  }
LAB_001059d4:
  uVar5 = 0;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_001059d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(uVar5,0);
  }
  __stack_chk_fail();
}

Assistant:

bool
strispassword_s (const char *dest, rsize_t dmax)
{
    uint32_t cnt_all;
    uint32_t cnt_lowercase;
    uint32_t cnt_uppercase;
    uint32_t cnt_numbers;
    uint32_t cnt_specials;

    if (!dest) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax < SAFE_STR_PASSWORD_MIN_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is too short",
                   NULL, ESLEMIN);
        return (false);
    }

    if (dmax > SAFE_STR_PASSWORD_MAX_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    cnt_all = cnt_lowercase = cnt_uppercase = 0;
    cnt_numbers = cnt_specials = 0;

    while (*dest) {

        if (dmax == 0) {
            invoke_safe_str_constraint_handler(
                      "strispassword_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (false);
        }
        dmax--;

        cnt_all++;

        if ((*dest >= '0') && (*dest <= '9')) {
            cnt_numbers++;

        } else if ((*dest >= 'a') && (*dest <= 'z')) {
            cnt_lowercase++;

        } else if ((*dest >= 'A') && (*dest <= 'Z')) {
            cnt_uppercase++;

        /* allow all specials */
        } else if ((*dest >= 33) && (*dest <= 47)) {
            cnt_specials++;
        } else if ((*dest >= 58) && (*dest <= 64)) {
            cnt_specials++;
        } else if ((*dest >= 91) && (*dest <= 94)) {
            cnt_specials++;
        } else if ((*dest >= 95) && (*dest <= 96)) {
            cnt_specials++;
        } else if ((*dest >= 123) && (*dest <= 126)) {
            cnt_specials++;

        } else {
            /* illegal char in password string */
            return (false);
        }
        dest++;
    }

    if (cnt_all < SAFE_STR_PASSWORD_MAX_LENGTH &&
        cnt_numbers >=  SAFE_STR_MIN_NUMBERS &&
        cnt_lowercase >= SAFE_STR_MIN_LOWERCASE &&
        cnt_uppercase >= SAFE_STR_MIN_UPPERCASE &&
        cnt_specials >= SAFE_STR_MIN_SPECIALS ) {
        return (true);
    } else {
        return (false);
    }
}